

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

void __thiscall Hpipe::Pool<Hpipe::CharItem,_32>::~Pool(Pool<Hpipe::CharItem,_32> *this)

{
  Set *pSVar1;
  Set *pSVar2;
  Set *pSVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  if (this->last != (Set *)0x0) {
    lVar4 = (long)this->used;
    lVar5 = lVar4 * 0x88;
    while( true ) {
      lVar5 = lVar5 + -0x88;
      bVar6 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar6) break;
      CharItem::~CharItem((CharItem *)((long)this->last + lVar5));
    }
    pSVar1 = this->last->prev;
    pSVar3 = this->last;
    while (pSVar2 = pSVar1, operator_delete(pSVar3,0x1108), pSVar2 != (Set *)0x0) {
      pSVar1 = pSVar2->prev;
      for (lVar4 = 0x1078; pSVar3 = pSVar2, lVar4 != -0x88; lVar4 = lVar4 + -0x88) {
        CharItem::~CharItem((CharItem *)(pSVar2->items + lVar4));
      }
    }
  }
  return;
}

Assistant:

~Pool() {
        if ( last ) {
            // delete the last
            for( int i = used; i--; )
                reinterpret_cast<T *>( last->items + sizeof( T ) * i )->~T();

            // previous items
            Set *c = last->prev;
            delete last;
            while( c ) {
                Set *p = c->prev;
                for( int i = s; i--; )
                    reinterpret_cast<T *>( c->items + sizeof( T ) * i )->~T();
                delete c;
                c = p;
            }
        }
    }